

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parallel.cpp
# Opt level: O2

void __thiscall
pbrt::ParallelForLoop2D::ParallelForLoop2D
          (ParallelForLoop2D *this,Bounds2i *extent,int chunkSize,
          function<void_(pbrt::Bounds2<int>)> *func)

{
  Tuple2<pbrt::Point2,_int> TVar1;
  
  (this->super_ParallelJob).activeWorkers = 0;
  (this->super_ParallelJob).removed = false;
  (this->super_ParallelJob).prev = (ParallelJob *)0x0;
  (this->super_ParallelJob).next = (ParallelJob *)0x0;
  (this->super_ParallelJob)._vptr_ParallelJob = (_func_int **)&PTR__ParallelForLoop2D_02db5fe8;
  std::function<void_(pbrt::Bounds2<int>)>::function(&this->func,func);
  TVar1 = (extent->pMax).super_Tuple2<pbrt::Point2,_int>;
  (this->extent).pMin.super_Tuple2<pbrt::Point2,_int> =
       (extent->pMin).super_Tuple2<pbrt::Point2,_int>;
  (this->extent).pMax.super_Tuple2<pbrt::Point2,_int> = TVar1;
  (this->nextStart).super_Tuple2<pbrt::Point2,_int> = (extent->pMin).super_Tuple2<pbrt::Point2,_int>
  ;
  this->chunkSize = chunkSize;
  return;
}

Assistant:

ParallelForLoop2D(const Bounds2i &extent, int chunkSize,
                      std::function<void(Bounds2i)> func)
        : func(std::move(func)),
          extent(extent),
          nextStart(extent.pMin),
          chunkSize(chunkSize) {}